

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe-test.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  
  iVar1 = microatf_tp_main(argc,argv,microatf_tp_add_tcs);
  return iVar1;
}

Assistant:

ATF_TP_ADD_TCS(tp)
{
	(void)print_statbuf;

	ATF_TP_ADD_TC(tp, pipe__simple_poll);
	ATF_TP_ADD_TC(tp, pipe__poll_write_end_after_read_end_close);
	ATF_TP_ADD_TC(tp, pipe__poll_full_write_end_after_read_end_close);
	ATF_TP_ADD_TC(tp, pipe__poll_full_write_end_after_read_end_close_hup);
	ATF_TP_ADD_TC(tp,
	    pipe__poll_full_minus_1b_write_end_after_read_end_close);
	ATF_TP_ADD_TC(tp,
	    pipe__poll_full_minus_511b_write_end_after_read_end_close);
	ATF_TP_ADD_TC(tp,
	    pipe__poll_full_minus_512b_write_end_after_read_end_close);
	ATF_TP_ADD_TC(tp, pipe__pipe_event_poll);
	ATF_TP_ADD_TC(tp, pipe__fifo_writes);
	ATF_TP_ADD_TC(tp, pipe__fifo_connecting_reader);
	ATF_TP_ADD_TC(tp, pipe__fifo_reads);
	ATF_TP_ADD_TC(tp, pipe__fifo_read_eof_wakeups);
	ATF_TP_ADD_TC(tp, pipe__fifo_read_eof_state_when_reconnecting);
	ATF_TP_ADD_TC(tp, pipe__closed_read_end);
	ATF_TP_ADD_TC(tp, pipe__closed_read_end_of_duplex);
	ATF_TP_ADD_TC(tp, pipe__closed_read_end_register_before_close);
	ATF_TP_ADD_TC(tp, pipe__closed_write_end);
	ATF_TP_ADD_TC(tp, pipe__closed_write_end_register_before_close);

	return atf_no_error();
}